

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteFieldStringBytesAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,Options *options,
               bool builder,bool kdoc,bool is_private)

{
  ushort uVar1;
  FieldAccessorType type_00;
  char *pcVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  size_t sStack_140;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  Options::Options(&local_80,options);
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field,&local_80,kdoc);
  Options::~Options(&local_80);
  Options::Options(&local_d0,options);
  WriteDebugString(printer,field,&local_d0,kdoc);
  Options::~Options(&local_d0);
  if (!kdoc && !is_private) {
    Options::Options(&local_120,options);
    WriteDeprecatedJavadoc(printer,field,type_00,&local_120);
    Options::~Options(&local_120);
  }
  switch(type) {
  case GETTER:
    local_130._M_str = (field->all_names_).payload_;
    local_130._M_len = (size_t)*(ushort *)(local_130._M_str + 10);
    local_130._M_str = local_130._M_str + -(ulong)*(ushort *)(local_130._M_str + 8);
    pcVar2 = " * @return The bytes for $name$.\n";
    sStack_140 = 0x21;
    break;
  case SETTER:
    local_130._M_str = (field->all_names_).payload_;
    local_130._M_len = (size_t)*(ushort *)(local_130._M_str + 10);
    local_130._M_str = local_130._M_str + -(ulong)*(ushort *)(local_130._M_str + 8);
    pcVar2 = " * @param value The bytes for $name$ to set.\n";
    sStack_140 = 0x2d;
    break;
  default:
    goto switchD_002815ed_caseD_3;
  case LIST_GETTER:
    local_130._M_str = (field->all_names_).payload_;
    local_130._M_len = (size_t)*(ushort *)(local_130._M_str + 10);
    local_130._M_str = local_130._M_str + -(ulong)*(ushort *)(local_130._M_str + 8);
    pcVar2 = " * @return A list containing the bytes for $name$.\n";
    sStack_140 = 0x33;
    break;
  case LIST_INDEXED_GETTER:
    text_00._M_str = " * @param index The index of the value to return.\n";
    text_00._M_len = 0x32;
    io::Printer::Print<>(printer,text_00);
    local_130._M_str = (field->all_names_).payload_;
    local_130._M_len = (size_t)*(ushort *)(local_130._M_str + 10);
    local_130._M_str = local_130._M_str + -(ulong)*(ushort *)(local_130._M_str + 8);
    pcVar2 = " * @return The bytes of the $name$ at the given index.\n";
    sStack_140 = 0x37;
    break;
  case LIST_INDEXED_SETTER:
    text_01._M_str = " * @param index The index to set the value at.\n";
    text_01._M_len = 0x2f;
    io::Printer::Print<>(printer,text_01);
    local_130._M_str = (field->all_names_).payload_;
    uVar1 = *(ushort *)(local_130._M_str + 10);
    local_130._M_str = local_130._M_str + -(ulong)*(ushort *)(local_130._M_str + 8);
    pcVar2 = " * @param value The bytes of the $name$ to set.\n";
    goto LAB_00281746;
  case LIST_ADDER:
    local_130._M_str = (field->all_names_).payload_;
    uVar1 = *(ushort *)(local_130._M_str + 10);
    local_130._M_str = local_130._M_str + -(ulong)*(ushort *)(local_130._M_str + 8);
    pcVar2 = " * @param value The bytes of the $name$ to add.\n";
LAB_00281746:
    local_130._M_len = (size_t)uVar1;
    sStack_140 = 0x30;
    break;
  case LIST_MULTI_ADDER:
    local_130._M_str = (field->all_names_).payload_;
    local_130._M_len = (size_t)*(ushort *)(local_130._M_str + 10);
    local_130._M_str = local_130._M_str + -(ulong)*(ushort *)(local_130._M_str + 8);
    pcVar2 = " * @param values The bytes of the $name$ to add.\n";
    sStack_140 = 0x31;
  }
  text_02._M_str = pcVar2;
  text_02._M_len = sStack_140;
  io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_02,(char (*) [5])0x651c1c,&local_130);
switchD_002815ed_caseD_3:
  if (builder) {
    text_03._M_str = " * @return This builder for chaining.\n";
    text_03._M_len = 0x26;
    io::Printer::Print<>(printer,text_03);
  }
  text_04._M_str = " */\n";
  text_04._M_len = 4;
  io::Printer::Print<>(printer,text_04);
  return;
}

Assistant:

void WriteFieldStringBytesAccessorDocComment(
    io::Printer* printer, const FieldDescriptor* field,
    const FieldAccessorType type, const Options options, const bool builder,
    const bool kdoc, const bool is_private) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field, options, kdoc);
  WriteDebugString(printer, field, options, kdoc);
  if (!kdoc && !is_private) {
    WriteDeprecatedJavadoc(printer, field, type, options);
  }
  switch (type) {
    case HAZZER:
      // Should never happen
      break;
    case GETTER:
      printer->Print(" * @return The bytes for $name$.\n", "name",
                     field->camelcase_name());
      break;
    case SETTER:
      printer->Print(" * @param value The bytes for $name$ to set.\n", "name",
                     field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      // Should never happen
      break;
    case LIST_GETTER:
      printer->Print(" * @return A list containing the bytes for $name$.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the value to return.\n");
      printer->Print(" * @return The bytes of the $name$ at the given index.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(" * @param value The bytes of the $name$ to set.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(" * @param value The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(" * @param values The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}